

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void updateAccumulator(Parse *pParse,int regAcc,AggInfo *pAggInfo,int eDistinctType)

{
  Vdbe *p;
  uint uVar1;
  int iVar2;
  int iVar3;
  undefined1 *in_RDX;
  int in_ESI;
  Parse *in_RDI;
  int j;
  ExprList_item *pItem;
  CollSeq *pColl;
  int regBase;
  int kk;
  ExprList *pOBList;
  int jj;
  Expr *pFilter;
  ExprList *pList;
  int regDistinct;
  int regAggSz;
  int regAgg;
  int addrNext;
  int nArg;
  AggInfo_col *pC;
  AggInfo_func *pF;
  int addrHitTest;
  int regHit;
  int i;
  Vdbe *v;
  int in_stack_ffffffffffffff48;
  int in_stack_ffffffffffffff4c;
  int in_stack_ffffffffffffff50;
  int in_stack_ffffffffffffff54;
  int in_stack_ffffffffffffff58;
  uint in_stack_ffffffffffffff5c;
  int in_stack_ffffffffffffff60;
  int in_stack_ffffffffffffff64;
  Vdbe *in_stack_ffffffffffffff68;
  CollSeq *in_stack_ffffffffffffff70;
  int in_stack_ffffffffffffff78;
  int in_stack_ffffffffffffff7c;
  Parse *in_stack_ffffffffffffff80;
  int in_stack_ffffffffffffff88;
  int in_stack_ffffffffffffff8c;
  Parse *in_stack_ffffffffffffff90;
  Expr *pExpr;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 uVar4;
  int local_50;
  int local_4c;
  long *local_40;
  int local_34;
  int local_30;
  int local_2c;
  
  p = in_RDI->pVdbe;
  local_30 = 0;
  local_34 = 0;
  if (in_RDI->nErr == 0) {
    *in_RDX = 1;
    local_2c = 0;
    local_40 = *(long **)(in_RDX + 0x28);
    for (; local_2c < *(int *)(in_RDX + 0x30); local_2c = local_2c + 1) {
      local_50 = 0;
      uVar4 = 0;
      pExpr = *(Expr **)(*local_40 + 0x20);
      if ((*(uint *)(*local_40 + 4) & 0x1000000) != 0) {
        in_stack_ffffffffffffff90 = *(Parse **)(*(long *)(*local_40 + 0x40) + 0x48);
        if (((*(int *)(in_RDX + 0x24) != 0) && ((*(uint *)(local_40[1] + 4) & 0x20) != 0)) &&
           (in_ESI != 0)) {
          if (local_30 == 0) {
            local_30 = in_RDI->nMem + 1;
            in_RDI->nMem = local_30;
          }
          sqlite3VdbeAddOp2((Vdbe *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                            in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48,0);
        }
        local_50 = sqlite3VdbeMakeLabel(in_RDI);
        sqlite3ExprIfFalse((Parse *)CONCAT44(uVar4,in_stack_ffffffffffffffa0),pExpr,
                           (int)((ulong)in_stack_ffffffffffffff90 >> 0x20),
                           (int)in_stack_ffffffffffffff90);
      }
      if ((int)local_40[3] < 0) {
        if (pExpr == (Expr *)0x0) {
          local_4c = 0;
        }
        else {
          local_4c._0_1_ = pExpr->op;
          local_4c._1_1_ = pExpr->affExpr;
          local_4c._2_1_ = pExpr->op2;
          local_4c._3_1_ = pExpr->field_0x3;
          sqlite3GetTempRange((Parse *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58)
                              ,in_stack_ffffffffffffff54);
          sqlite3ExprCodeExprList
                    (in_stack_ffffffffffffff90,
                     (ExprList *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),
                     (int)((ulong)in_stack_ffffffffffffff80 >> 0x20),(int)in_stack_ffffffffffffff80,
                     (u8)((uint)in_stack_ffffffffffffff7c >> 0x18));
        }
      }
      else {
        uVar4 = 0xaaaaaaaa;
        local_4c = *(int *)pExpr;
        in_stack_ffffffffffffff80 = *(Parse **)(*(long *)(*local_40 + 0x10) + 0x20);
        iVar2 = sqlite3GetTempRange((Parse *)CONCAT44(in_stack_ffffffffffffff5c,
                                                      in_stack_ffffffffffffff58),
                                    in_stack_ffffffffffffff54);
        iVar3 = iVar2;
        sqlite3ExprCodeExprList
                  (in_stack_ffffffffffffff90,(ExprList *)CONCAT44(uVar4,in_stack_ffffffffffffff88),
                   (int)((ulong)in_stack_ffffffffffffff80 >> 0x20),(int)in_stack_ffffffffffffff80,
                   (u8)((uint)in_stack_ffffffffffffff7c >> 0x18));
        in_stack_ffffffffffffff8c = *(int *)&in_stack_ffffffffffffff80->db;
        if (*(char *)((long)local_40 + 0x1d) == '\0') {
          sqlite3VdbeAddOp2((Vdbe *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                            in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48,0);
          in_stack_ffffffffffffff8c = in_stack_ffffffffffffff8c + 1;
        }
        if (*(char *)((long)local_40 + 0x1c) != '\0') {
          iVar3 = iVar2 + in_stack_ffffffffffffff8c;
          sqlite3ExprCodeExprList
                    (in_stack_ffffffffffffff90,
                     (ExprList *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),
                     (int)((ulong)in_stack_ffffffffffffff80 >> 0x20),(int)in_stack_ffffffffffffff80,
                     (u8)((uint)in_stack_ffffffffffffff7c >> 0x18));
          in_stack_ffffffffffffff8c = local_4c + in_stack_ffffffffffffff8c;
        }
        if (*(char *)((long)local_40 + 0x1e) != '\0') {
          if (*(char *)((long)local_40 + 0x1c) != '\0') {
            iVar2 = iVar3;
          }
          in_stack_ffffffffffffff78 = iVar2;
          for (in_stack_ffffffffffffff7c = 0; in_stack_ffffffffffffff60 = iVar2,
              in_stack_ffffffffffffff7c < local_4c;
              in_stack_ffffffffffffff7c = in_stack_ffffffffffffff7c + 1) {
            sqlite3VdbeAddOp2((Vdbe *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                              in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48,0);
            in_stack_ffffffffffffff8c = in_stack_ffffffffffffff8c + 1;
          }
        }
      }
      if ((-1 < (int)local_40[2]) && (pExpr != (Expr *)0x0)) {
        if (local_50 == 0) {
          local_50 = sqlite3VdbeMakeLabel(in_RDI);
        }
        iVar2 = codeDistinct(in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c,
                             in_stack_ffffffffffffff88,
                             (int)((ulong)in_stack_ffffffffffffff80 >> 0x20),
                             (ExprList *)
                             CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),
                             (int)((ulong)in_stack_ffffffffffffff70 >> 0x20));
        *(int *)(local_40 + 2) = iVar2;
      }
      if ((int)local_40[3] < 0) {
        if ((*(uint *)(local_40[1] + 4) & 0x20) != 0) {
          in_stack_ffffffffffffff70 = (CollSeq *)0x0;
          in_stack_ffffffffffffff64 = 0;
          in_stack_ffffffffffffff68 = (Vdbe *)&pExpr->u;
          while( true ) {
            uVar1 = in_stack_ffffffffffffff5c & 0xffffff;
            if (in_stack_ffffffffffffff70 == (CollSeq *)0x0) {
              uVar1 = CONCAT13(in_stack_ffffffffffffff64 < local_4c,(int3)in_stack_ffffffffffffff5c)
              ;
            }
            in_stack_ffffffffffffff5c = uVar1;
            if ((char)(in_stack_ffffffffffffff5c >> 0x18) == '\0') break;
            in_stack_ffffffffffffff70 =
                 sqlite3ExprCollSeq(in_stack_ffffffffffffff80,
                                    (Expr *)CONCAT44(in_stack_ffffffffffffff7c,
                                                     in_stack_ffffffffffffff78));
            in_stack_ffffffffffffff64 = in_stack_ffffffffffffff64 + 1;
            in_stack_ffffffffffffff68 = (Vdbe *)&in_stack_ffffffffffffff68->pParse;
          }
          if (in_stack_ffffffffffffff70 == (CollSeq *)0x0) {
            in_stack_ffffffffffffff70 = in_RDI->db->pDfltColl;
          }
          if ((local_30 == 0) && (*(int *)(in_RDX + 0x24) != 0)) {
            local_30 = in_RDI->nMem + 1;
            in_RDI->nMem = local_30;
          }
          in_stack_ffffffffffffff48 = -2;
          sqlite3VdbeAddOp4((Vdbe *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                            in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58,
                            in_stack_ffffffffffffff54,in_stack_ffffffffffffff50,
                            (char *)CONCAT44(in_stack_ffffffffffffff4c,0xfffffffe),
                            (int)in_stack_ffffffffffffff70);
        }
        sqlite3VdbeAddOp3(in_stack_ffffffffffffff68,in_stack_ffffffffffffff64,
                          in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c,
                          in_stack_ffffffffffffff58);
        sqlite3VdbeAppendP4((Vdbe *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                            (void *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58),
                            in_stack_ffffffffffffff54);
        sqlite3VdbeChangeP5(p,(u16)local_4c);
        sqlite3ReleaseTempRange
                  ((Parse *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                   in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48);
      }
      else {
        sqlite3VdbeAddOp3(in_stack_ffffffffffffff68,in_stack_ffffffffffffff64,
                          in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c,
                          in_stack_ffffffffffffff58);
        sqlite3VdbeAddOp4Int
                  (in_stack_ffffffffffffff68,in_stack_ffffffffffffff64,in_stack_ffffffffffffff60,
                   in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58,in_stack_ffffffffffffff54);
        sqlite3ReleaseTempRange
                  ((Parse *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                   in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48);
      }
      if (local_50 != 0) {
        sqlite3VdbeResolveLabel
                  ((Vdbe *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                   in_stack_ffffffffffffff5c);
      }
      if (in_RDI->nErr != 0) {
        return;
      }
      local_40 = local_40 + 4;
    }
    if ((local_30 == 0) && (*(int *)(in_RDX + 0x24) != 0)) {
      local_30 = in_ESI;
    }
    if (local_30 != 0) {
      local_34 = sqlite3VdbeAddOp1((Vdbe *)CONCAT44(in_stack_ffffffffffffff54,
                                                    in_stack_ffffffffffffff50),
                                   in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48);
    }
    for (local_2c = 0; local_2c < *(int *)(in_RDX + 0x24); local_2c = local_2c + 1) {
      sqlite3ExprCode((Parse *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                      (Expr *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58),
                      in_stack_ffffffffffffff54);
      if (in_RDI->nErr != 0) {
        return;
      }
    }
    *in_RDX = 0;
    if (local_34 != 0) {
      sqlite3VdbeJumpHereOrPopInst
                ((Vdbe *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                 in_stack_ffffffffffffff4c);
    }
  }
  return;
}

Assistant:

static void updateAccumulator(
  Parse *pParse,
  int regAcc,
  AggInfo *pAggInfo,
  int eDistinctType
){
  Vdbe *v = pParse->pVdbe;
  int i;
  int regHit = 0;
  int addrHitTest = 0;
  struct AggInfo_func *pF;
  struct AggInfo_col *pC;

  assert( pAggInfo->iFirstReg>0 );
  if( pParse->nErr ) return;
  pAggInfo->directMode = 1;
  for(i=0, pF=pAggInfo->aFunc; i<pAggInfo->nFunc; i++, pF++){
    int nArg;
    int addrNext = 0;
    int regAgg;
    int regAggSz = 0;
    int regDistinct = 0;
    ExprList *pList;
    assert( ExprUseXList(pF->pFExpr) );
    assert( !IsWindowFunc(pF->pFExpr) );
    assert( pF->pFunc!=0 );
    pList = pF->pFExpr->x.pList;
    if( ExprHasProperty(pF->pFExpr, EP_WinFunc) ){
      Expr *pFilter = pF->pFExpr->y.pWin->pFilter;
      if( pAggInfo->nAccumulator
       && (pF->pFunc->funcFlags & SQLITE_FUNC_NEEDCOLL)
       && regAcc
      ){
        /* If regAcc==0, there there exists some min() or max() function
        ** without a FILTER clause that will ensure the magnet registers
        ** are populated. */
        if( regHit==0 ) regHit = ++pParse->nMem;
        /* If this is the first row of the group (regAcc contains 0), clear the
        ** "magnet" register regHit so that the accumulator registers
        ** are populated if the FILTER clause jumps over the the
        ** invocation of min() or max() altogether. Or, if this is not
        ** the first row (regAcc contains 1), set the magnet register so that
        ** the accumulators are not populated unless the min()/max() is invoked
        ** and indicates that they should be.  */
        sqlite3VdbeAddOp2(v, OP_Copy, regAcc, regHit);
      }
      addrNext = sqlite3VdbeMakeLabel(pParse);
      sqlite3ExprIfFalse(pParse, pFilter, addrNext, SQLITE_JUMPIFNULL);
    }
    if( pF->iOBTab>=0 ){
      /* Instead of invoking AggStep, we must push the arguments that would
      ** have been passed to AggStep onto the sorting table. */
      int jj;                /* Registered used so far in building the record */
      ExprList *pOBList;     /* The ORDER BY clause */
      assert( pList!=0 );
      nArg = pList->nExpr;
      assert( nArg>0 );
      assert( pF->pFExpr->pLeft!=0 );
      assert( pF->pFExpr->pLeft->op==TK_ORDER );
      assert( ExprUseXList(pF->pFExpr->pLeft) );
      pOBList = pF->pFExpr->pLeft->x.pList;
      assert( pOBList!=0 );
      assert( pOBList->nExpr>0 );
      regAggSz = pOBList->nExpr;
      if( !pF->bOBUnique ){
        regAggSz++;   /* One register for OP_Sequence */
      }
      if( pF->bOBPayload ){
        regAggSz += nArg;
      }
      if( pF->bUseSubtype ){
        regAggSz += nArg;
      }
      regAggSz++;  /* One extra register to hold result of MakeRecord */
      regAgg = sqlite3GetTempRange(pParse, regAggSz);
      regDistinct = regAgg;
      sqlite3ExprCodeExprList(pParse, pOBList, regAgg, 0, SQLITE_ECEL_DUP);
      jj = pOBList->nExpr;
      if( !pF->bOBUnique ){
        sqlite3VdbeAddOp2(v, OP_Sequence, pF->iOBTab, regAgg+jj);
        jj++;
      }
      if( pF->bOBPayload ){
        regDistinct = regAgg+jj;
        sqlite3ExprCodeExprList(pParse, pList, regDistinct, 0, SQLITE_ECEL_DUP);
        jj += nArg;
      }
      if( pF->bUseSubtype ){
        int kk;
        int regBase = pF->bOBPayload ? regDistinct : regAgg;
        for(kk=0; kk<nArg; kk++, jj++){
          sqlite3VdbeAddOp2(v, OP_GetSubtype, regBase+kk, regAgg+jj);
        }
      }
    }else if( pList ){
      nArg = pList->nExpr;
      regAgg = sqlite3GetTempRange(pParse, nArg);
      regDistinct = regAgg;
      sqlite3ExprCodeExprList(pParse, pList, regAgg, 0, SQLITE_ECEL_DUP);
    }else{
      nArg = 0;
      regAgg = 0;
    }
    if( pF->iDistinct>=0 && pList ){
      if( addrNext==0 ){
        addrNext = sqlite3VdbeMakeLabel(pParse);
      }
      pF->iDistinct = codeDistinct(pParse, eDistinctType,
          pF->iDistinct, addrNext, pList, regDistinct);
    }
    if( pF->iOBTab>=0 ){
      /* Insert a new record into the ORDER BY table */
      sqlite3VdbeAddOp3(v, OP_MakeRecord, regAgg, regAggSz-1,
                        regAgg+regAggSz-1);
      sqlite3VdbeAddOp4Int(v, OP_IdxInsert, pF->iOBTab, regAgg+regAggSz-1,
                           regAgg, regAggSz-1);
      sqlite3ReleaseTempRange(pParse, regAgg, regAggSz);
    }else{
      /* Invoke the AggStep function */
      if( pF->pFunc->funcFlags & SQLITE_FUNC_NEEDCOLL ){
        CollSeq *pColl = 0;
        struct ExprList_item *pItem;
        int j;
        assert( pList!=0 );  /* pList!=0 if pF->pFunc has NEEDCOLL */
        for(j=0, pItem=pList->a; !pColl && j<nArg; j++, pItem++){
          pColl = sqlite3ExprCollSeq(pParse, pItem->pExpr);
        }
        if( !pColl ){
          pColl = pParse->db->pDfltColl;
        }
        if( regHit==0 && pAggInfo->nAccumulator ) regHit = ++pParse->nMem;
        sqlite3VdbeAddOp4(v, OP_CollSeq, regHit, 0, 0,
                         (char *)pColl, P4_COLLSEQ);
      }
      sqlite3VdbeAddOp3(v, OP_AggStep, 0, regAgg, AggInfoFuncReg(pAggInfo,i));
      sqlite3VdbeAppendP4(v, pF->pFunc, P4_FUNCDEF);
      sqlite3VdbeChangeP5(v, (u16)nArg);
      sqlite3ReleaseTempRange(pParse, regAgg, nArg);
    }
    if( addrNext ){
      sqlite3VdbeResolveLabel(v, addrNext);
    }
    if( pParse->nErr ) return;
  }
  if( regHit==0 && pAggInfo->nAccumulator ){
    regHit = regAcc;
  }
  if( regHit ){
    addrHitTest = sqlite3VdbeAddOp1(v, OP_If, regHit); VdbeCoverage(v);
  }
  for(i=0, pC=pAggInfo->aCol; i<pAggInfo->nAccumulator; i++, pC++){
    sqlite3ExprCode(pParse, pC->pCExpr, AggInfoColumnReg(pAggInfo,i));
    if( pParse->nErr ) return;
  }

  pAggInfo->directMode = 0;
  if( addrHitTest ){
    sqlite3VdbeJumpHereOrPopInst(v, addrHitTest);
  }
}